

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock.c
# Opt level: O0

int nn_sock_hold(nn_sock *self)

{
  nn_sock *self_local;
  
  if (self->state - 1U < 2) {
    self->holds = self->holds + 1;
    self_local._4_4_ = 0;
  }
  else if (self->state == 3) {
    self_local._4_4_ = -0x9523dfd;
  }
  else {
    self_local._4_4_ = -9;
  }
  return self_local._4_4_;
}

Assistant:

int nn_sock_hold (struct nn_sock *self)
{
    switch (self->state) {
    case NN_SOCK_STATE_ACTIVE:
    case NN_SOCK_STATE_INIT:
        self->holds++;
        return 0;
    case NN_SOCK_STATE_ZOMBIE:
        return -ETERM;
    case NN_SOCK_STATE_STOPPING:
    case NN_SOCK_STATE_STOPPING_EPS:
    case NN_SOCK_STATE_FINI:
    default:
        return -EBADF;
    }
}